

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormatT.cc
# Opt level: O2

size_t OpenMesh::IO::store<int>(ostream *_os,int *_val,undefined4 _b,bool _swap)

{
  size_t sVar1;
  long local_18;
  int64 v_2;
  int32 v_1;
  int16 v_3;
  int8 v;
  
  switch(_b) {
  case 0:
    v_2._7_1_ = (undefined1)*_val;
    sVar1 = binary<char>::store(_os,(value_type *)((long)&v_2 + 7),_swap);
    break;
  case 1:
    v_2._4_2_ = (undefined2)*_val;
    sVar1 = binary<short>::store(_os,(value_type *)((long)&v_2 + 4),_swap);
    break;
  case 2:
    v_2._0_4_ = *_val;
    sVar1 = binary<int>::store(_os,(value_type *)&v_2,_swap);
    break;
  case 3:
    local_18 = (long)*_val;
    sVar1 = binary<long_long>::store(_os,&local_18,_swap);
    break;
  default:
    return 0;
  }
  return sVar1;
}

Assistant:

size_t 
  store( std::ostream& _os, 
	 const T& _val, 
	 OMFormat::Chunk::Integer_Size _b, 
	 bool _swap,
	 t_signed)
  {    
    assert( OMFormat::is_integer( _val ) );

    switch( _b ) 
    {
      case OMFormat::Chunk::Integer_8:
      { 	
	OMFormat::int8 v = static_cast<OMFormat::int8>(_val);
	return store( _os, v, _swap );
      }
      case OMFormat::Chunk::Integer_16:
      { 
	OMFormat::int16 v = static_cast<OMFormat::int16>(_val);
	return store( _os, v, _swap );
      }
      case OMFormat::Chunk::Integer_32:
      { 
	OMFormat::int32 v = static_cast<OMFormat::int32>(_val);
	return store( _os, v, _swap );
      }      
      case OMFormat::Chunk::Integer_64:
      { 
	OMFormat::int64 v = static_cast<OMFormat::int64>(_val);
	return store( _os, v, _swap );
      }
    }
    return 0;
  }